

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

uint32_t __thiscall Samba::readWord(Samba *this,uint32_t addr)

{
  int iVar1;
  pointer pSVar2;
  SambaError *pSVar3;
  uint uVar4;
  byte local_21;
  uint32_t value;
  uint8_t cmd [13];
  uint32_t addr_local;
  Samba *this_local;
  
  cmd._5_4_ = addr;
  unique0x100001a7 = this;
  snprintf((char *)&local_21,0xd,"w%08X,4#",(ulong)addr);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,&local_21,0xc);
  if (iVar1 != 0xc) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[5])(pSVar2,&local_21,4);
  if (iVar1 != 4) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  uVar4 = (uint)value._2_1_ << 0x18 | (uint)value._1_1_ << 0x10 | (uint)(byte)value << 8 |
          (uint)local_21;
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x)=%#x\n","readWord",(ulong)(uint)cmd._5_4_,(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

uint32_t
Samba::readWord(uint32_t addr)
{
    uint8_t cmd[13];
    uint32_t value;

    snprintf((char*) cmd, sizeof(cmd), "w%08X,4#", addr);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();
    if (_port->read(cmd, sizeof(uint32_t)) != sizeof(uint32_t))
        throw SambaError();

    value = (cmd[3] << 24 | cmd[2] << 16 | cmd[1] << 8 | cmd[0] << 0);

    if (_debug)
        printf("%s(addr=%#x)=%#x\n", __FUNCTION__, addr, value);

    return value;
}